

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void __thiscall VmValue::AddUse(VmValue *this,VmValue *user)

{
  VmValue *local_8;
  
  local_8 = user;
  if ((this->type).size != 0 || (this->type).type != VM_TYPE_VOID) {
    this->hasKnownSimpleUse = false;
    SmallArray<VmValue_*,_8U>::push_back(&this->users,&local_8);
    return;
  }
  __assert_fail("type != VmType::Void",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x76b,"void VmValue::AddUse(VmValue *)");
}

Assistant:

void VmValue::AddUse(VmValue* user)
{
	// Can't use empty values
	assert(type != VmType::Void);

	// New user might not be simple
	hasKnownSimpleUse = false;

	users.push_back(user);
}